

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_msg_generator.c
# Opt level: O1

rfc5444_result
rfc5444_writer_forward_msg
          (rfc5444_writer *writer,rfc5444_reader_tlvblock_context *context,uint8_t *msg,size_t len)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  rfc5444_result rVar4;
  avl_node *paVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  void *__dest;
  rfc5444_writer_target *prVar9;
  bool bVar10;
  list_entity *plVar11;
  long lVar12;
  list_entity *plVar13;
  size_t msg_size;
  size_t generic_size;
  uint local_68;
  size_t local_60;
  size_t local_58;
  avl_node *local_50;
  rfc5444_reader_tlvblock_context *local_48;
  long local_40;
  ulong local_38;
  
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_msg_generator.c"
                  ,0x1d1,
                  "enum rfc5444_result rfc5444_writer_forward_msg(struct rfc5444_writer *, struct rfc5444_reader_tlvblock_context *, const uint8_t *, size_t)"
                 );
  }
  paVar5 = avl_find(&writer->_msgcreators,&context->msg_type);
  if (paVar5 == (avl_node *)0x0) {
    rVar4 = RFC5444_NO_MSGCREATOR;
  }
  else {
    if (paVar5[4].list.prev != (list_entity *)0x0) {
      plVar13 = (writer->_targets).next;
      prVar9 = (rfc5444_writer_target *)(plVar13 + -3);
      local_50 = paVar5;
      local_48 = context;
      if (plVar13->prev == (writer->_targets).prev) {
        bVar10 = false;
      }
      else {
        bVar10 = false;
        do {
          cVar2 = (*(code *)paVar5[4].list.prev)(prVar9,context);
          if (cVar2 != '\0') {
            plVar11 = (writer->_forwarding_processors).list_head.next;
            if (plVar11->prev == (writer->_forwarding_processors).list_head.prev) {
              lVar12 = 0;
            }
            else {
              lVar12 = 0;
              do {
                cVar2 = (*(code *)plVar11[4].next)(plVar11,*msg);
                if (cVar2 != '\0') {
                  lVar12 = lVar12 + (ulong)*(ushort *)((long)&plVar11[3].prev + 4);
                }
                plVar11 = plVar11->next;
              } while (plVar11->prev != (writer->_forwarding_processors).list_head.prev);
            }
            if (*(char *)&plVar13[1].next == '\0') {
              uVar8 = (long)plVar13[4].next -
                      ((long)&(plVar13[4].prev)->next +
                      (long)&(plVar13[2].prev)->next +
                      (long)&(plVar13[2].next)->next + (long)&(plVar13[3].next)->next);
              if (uVar8 < len + lVar12) {
                rfc5444_writer_flush(writer,prVar9,false);
              }
            }
            else {
              uVar8 = 0;
            }
            if (*(char *)&plVar13[1].next == '\x01') {
              _rfc5444_writer_begin_packet(writer,prVar9);
              uVar8 = (long)plVar13[4].next -
                      ((long)&(plVar13[4].prev)->next +
                      (long)&(plVar13[2].prev)->next +
                      (long)&(plVar13[2].next)->next + (long)&(plVar13[3].next)->next);
            }
            bVar10 = true;
            context = local_48;
            paVar5 = local_50;
            if (uVar8 < lVar12 + len) {
              return RFC5444_FW_MESSAGE_TOO_LONG;
            }
          }
          plVar13 = plVar13->next;
          prVar9 = (rfc5444_writer_target *)(plVar13 + -3);
        } while (plVar13->prev != (writer->_targets).prev);
      }
      if (!bVar10) {
        return RFC5444_OKAY;
      }
      memcpy(_msg_buffer,(writer->_msg).buffer,len);
      plVar13 = (writer->_forwarding_processors).list_head.next;
      local_58 = len;
      if (plVar13->prev != (writer->_forwarding_processors).list_head.prev) {
        do {
          cVar2 = (*(code *)plVar13[4].next)(plVar13,*msg);
          if ((cVar2 != '\0') && (*(char *)((long)&plVar13[3].prev + 6) == '\0')) {
            iVar3 = (*(code *)plVar13[4].prev)(plVar13,prVar9,context,_msg_buffer,&local_58);
            if (iVar3 != 0) {
              return RFC5444_FW_BAD_TRANSFORM;
            }
            if (local_58 == 0) goto LAB_001503fb;
          }
          plVar13 = plVar13->next;
        } while (plVar13->prev != (writer->_forwarding_processors).list_head.prev);
      }
      bVar1 = msg[1];
      uVar6 = 4;
      if ((char)bVar1 < '\0') {
        uVar6 = (uint)(byte)((bVar1 & 0xf) + 5);
      }
      uVar7 = -(uint)((bVar1 & 0x40) == 0) | uVar6;
      local_68 = bVar1 & 0x40;
      if (((bVar1 & 0x40) != 0) && (msg[uVar7] < 2)) {
        return RFC5444_OKAY;
      }
      plVar13 = (writer->_targets).next;
      if (plVar13->prev == (writer->_targets).prev) {
        return RFC5444_OKAY;
      }
      local_38 = (ulong)uVar7;
      local_40 = (long)(int)(-(uint)((bVar1 & 0x20) == 0) | (local_68 >> 6) + uVar6);
      paVar5 = local_50;
      do {
        prVar9 = (rfc5444_writer_target *)(plVar13 + -3);
        cVar2 = (*(code *)paVar5[4].list.prev)(prVar9,context);
        if (cVar2 != '\0') {
          __dest = (void *)((long)&(plVar13[4].prev)->next +
                           (long)&(plVar13[2].prev)->next +
                           (long)&(plVar13[3].next)->next +
                           (long)&(plVar13[1].prev)->next + (long)plVar13[2].next);
          if ((ulong)((long)&(plVar13[1].prev)->next + (long)plVar13[4].next) <
              local_58 + (long)__dest) {
            __assert_fail("ptr + generic_size <= target->_pkt.buffer + target->_pkt.max",
                          "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_msg_generator.c"
                          ,0x244,
                          "enum rfc5444_result rfc5444_writer_forward_msg(struct rfc5444_writer *, struct rfc5444_reader_tlvblock_context *, const uint8_t *, size_t)"
                         );
          }
          memcpy(__dest,msg,local_58);
          local_60 = local_58;
          for (plVar11 = (writer->_forwarding_processors).list_head.next;
              plVar11->prev != (writer->_forwarding_processors).list_head.prev;
              plVar11 = plVar11->next) {
            cVar2 = (*(code *)plVar11[4].next)(plVar11,*msg);
            if ((cVar2 != '\0') && (*(char *)((long)&plVar11[3].prev + 6) == '\x01')) {
              iVar3 = (*(code *)plVar11[4].prev)(plVar11,prVar9,local_48,__dest,&local_60);
              if (iVar3 != 0) {
                return RFC5444_FW_BAD_TRANSFORM;
              }
              if (local_60 == 0) break;
            }
          }
          paVar5 = local_50;
          if (local_60 != 0) {
            plVar13[4].prev = (list_entity *)((long)&(plVar13[4].prev)->next + local_60);
            *(char *)((long)__dest + 2) = (char)(local_60 >> 8);
            *(undefined1 *)((long)__dest + 3) = (undefined1)local_60;
            if ((bVar1 & 0x40) != 0) {
              *(char *)((long)__dest + local_38) = *(char *)((long)__dest + local_38) + -1;
            }
            if ((bVar1 & 0x20) != 0) {
              *(char *)((long)__dest + local_40) = *(char *)((long)__dest + local_40) + '\x01';
            }
            if (writer->message_generation_notifier != (_func_void_rfc5444_writer_target_ptr *)0x0)
            {
              (*writer->message_generation_notifier)(prVar9);
            }
          }
        }
        plVar13 = plVar13->next;
        context = local_48;
      } while (plVar13->prev != (writer->_targets).prev);
    }
LAB_001503fb:
    rVar4 = RFC5444_OKAY;
  }
  return rVar4;
}

Assistant:

enum rfc5444_result
rfc5444_writer_forward_msg(
  struct rfc5444_writer *writer, struct rfc5444_reader_tlvblock_context *context, const uint8_t *msg, size_t len)
{
  struct rfc5444_writer_target *target;
  struct rfc5444_writer_message *rfc5444_msg;
  struct rfc5444_writer_forward_handler *handler;
  int cnt, hopcount, hoplimit;
  size_t max, transformer_overhead;
  size_t generic_size, msg_size;
  uint8_t flags, addr_len;
  uint8_t *ptr;
  bool shall_forward;
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  rfc5444_msg = avl_find_element(&writer->_msgcreators, &context->msg_type, rfc5444_msg, _msgcreator_node);
  if (rfc5444_msg == NULL) {
    /* error, no msgcreator found */
    return RFC5444_NO_MSGCREATOR;
  }

  if (!rfc5444_msg->forward_target_selector) {
    /* no forwarding handler, do not forward */
    return RFC5444_OKAY;
  }

  /* 1.) first flush all interfaces that have (too) full buffers */
  shall_forward = false;
  list_for_each_element(&writer->_targets, target, _target_node) {
    if (!rfc5444_msg->forward_target_selector(target, context)) {
      continue;
    }

    shall_forward = true;
    transformer_overhead = 0;
    avl_for_each_element(&writer->_forwarding_processors, handler, _node) {
      if (handler->is_matching_signature(handler, msg[0])) {
        transformer_overhead += handler->allocate_space;
      }
    }

    max = 0;
    if (!target->_is_flushed) {
      max =
        target->_pkt.max - (target->_pkt.header + target->_pkt.added + target->_pkt.allocated + target->_bin_msgs_size);

      if (len + transformer_overhead > max) {
        /* flush the old packet */
        rfc5444_writer_flush(writer, target, false);
      }
    }

    if (target->_is_flushed) {
      /* begin a new packet */
      _rfc5444_writer_begin_packet(writer, target);
      max =
        target->_pkt.max - (target->_pkt.header + target->_pkt.added + target->_pkt.allocated + target->_bin_msgs_size);
    }

    if (len + transformer_overhead > max) {
      /* message too long, too much data in it */
      return RFC5444_FW_MESSAGE_TOO_LONG;
    }
  }

  if (!shall_forward) {
    /* no target to forward message, everything done */
    return RFC5444_OKAY;
  }

  /* 2.) generate message and do non-target specific post processors */
  ptr = _msg_buffer;
  memcpy(ptr, writer->_msg.buffer, len);

  /* remember length */
  generic_size = len;

  /* run processors (unpspecific) forwarding processors */
  avl_for_each_element(&writer->_forwarding_processors, handler, _node) {
    if (handler->is_matching_signature(handler, msg[0]) && !handler->target_specific) {
      if (handler->process(handler, target, context, _msg_buffer, &generic_size)) {
        /* error, we have not modified the _bin_msgs_size, so we can just return */
        return RFC5444_FW_BAD_TRANSFORM;
      }

      if (generic_size == 0) {
        return RFC5444_OKAY;
      }
    }
  }

  /* 3) grab index of header structures */
  flags = msg[1];
  addr_len = (flags & RFC5444_MSG_FLAG_ADDRLENMASK) + 1;

  cnt = 4;
  hopcount = -1;
  hoplimit = -1;

  if ((flags & RFC5444_MSG_FLAG_ORIGINATOR) != 0) {
    cnt += addr_len;
  }
  if ((flags & RFC5444_MSG_FLAG_HOPLIMIT) != 0) {
    hoplimit = cnt++;
  }
  if ((flags & RFC5444_MSG_FLAG_HOPCOUNT) != 0) {
    hopcount = cnt++;
  }
  if ((flags & RFC5444_MSG_FLAG_SEQNO) != 0) {
    cnt += 2;
  }

  if (hoplimit != -1 && msg[hoplimit] <= 1) {
    /* do not forward a message with hopcount 1 or 0 */
    return RFC5444_OKAY;
  }

  /* forward message */
  list_for_each_element(&writer->_targets, target, _target_node) {
    if (!rfc5444_msg->forward_target_selector(target, context)) {
      continue;
    }

    ptr =
      &target->_pkt.buffer[target->_pkt.header + target->_pkt.added + target->_pkt.allocated + target->_bin_msgs_size];

    /* copy message into packet buffer */
    assert(ptr + generic_size <= target->_pkt.buffer + target->_pkt.max);
    memcpy(ptr, msg, generic_size);

    /* remember position of first copy */
    msg_size = generic_size;

    /* run processors */
    avl_for_each_element(&writer->_forwarding_processors, handler, _node) {
      if (handler->is_matching_signature(handler, msg[0]) && handler->target_specific) {
        if (handler->process(handler, target, context, ptr, &msg_size)) {
          /* error, we have not modified the _bin_msgs_size, so we can just return */
          return RFC5444_FW_BAD_TRANSFORM;
        }
        if (msg_size == 0) {
          break;
        }
      }
    }

    if (msg_size > 0) {
      target->_bin_msgs_size += msg_size;

      /* correct message */
      ptr[2] = msg_size >> 8;
      ptr[3] = msg_size & 0xff;

      /* correct hoplimit if necesssary */
      if (hoplimit != -1) {
        ptr[hoplimit]--;
      }

      /* correct hopcount if necessary */
      if (hopcount != -1) {
        ptr[hopcount]++;
      }

      if (writer->message_generation_notifier) {
        writer->message_generation_notifier(target);
      }
    }
  }
  return RFC5444_OKAY;
}